

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4to16.h
# Opt level: O3

void ncnn::conv1x1s2_sgemm_pack4to16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  uint _c;
  int _w;
  int _h;
  undefined8 uVar2;
  int *piVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  Mat local_78;
  
  iVar1 = bottom_blob->w;
  _c = bottom_blob->c;
  _w = top_blob->w;
  _h = top_blob->h;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,_w,_h,_c,bottom_blob->elemsize,bottom_blob->elempack,
              opt->workspace_allocator);
  if (0 < (int)_c) {
    uVar4 = 0;
    do {
      if (0 < _h) {
        puVar5 = (undefined8 *)
                 (local_78.cstep * uVar4 *
                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) +
                 (long)local_78.data);
        puVar6 = (undefined8 *)
                 (bottom_blob->cstep * uVar4 * bottom_blob->elemsize + (long)bottom_blob->data);
        iVar7 = 0;
        do {
          iVar8 = _w;
          if (0 < _w) {
            do {
              uVar2 = puVar6[1];
              *puVar5 = *puVar6;
              puVar5[1] = uVar2;
              puVar6 = puVar6 + 4;
              puVar5 = puVar5 + 2;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
          puVar6 = (undefined8 *)((long)puVar6 + (long)((iVar1 - _w) * 8) * 4);
          iVar7 = iVar7 + 1;
        } while (iVar7 != _h);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != _c);
  }
  conv1x1s1_sgemm_pack4to16_avx512(&local_78,top_blob,kernel,_bias,opt);
  piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack4to16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _v = _mm_load_ps(r0);
                _mm_store_ps(outptr, _v);

                r0 += 8;
                outptr += 4;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack4to16_avx512(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}